

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * nite::strRemoveEndline(string *__return_storage_ptr__,string *Input)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  string local_58;
  undefined1 local_38 [8];
  string Buffer;
  string *Input_local;
  
  Buffer.field_2._8_8_ = Input;
  std::__cxx11::string::string((string *)local_38);
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
LAB_00225fa5:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)Input);
    std::__cxx11::string::~string((string *)local_38);
    return __return_storage_ptr__;
  }
  iVar3 = std::__cxx11::string::length();
  strAt(&local_58,Input,iVar3 - 1);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  do {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"\n");
    if (bVar1) {
LAB_00225f02:
      lVar4 = std::__cxx11::string::length();
      bVar1 = lVar4 != 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"\r");
      bVar1 = false;
      if (bVar2) goto LAB_00225f02;
    }
    if (!bVar1) goto LAB_00225fa5;
    lVar4 = std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)Input,lVar4 - 1);
    lVar4 = std::__cxx11::string::length();
    if (lVar4 == 0) goto LAB_00225fa5;
    std::__cxx11::string::length();
    pcVar5 = (char *)std::__cxx11::string::at((ulong)Input);
    std::__cxx11::string::operator=((string *)local_38,*pcVar5);
  } while( true );
}

Assistant:

String nite::strRemoveEndline(String Input){
	String Buffer;
	if (Input.length()>0){
		Buffer = nite::strAt(Input,Input.length()-1);
		while ( (Buffer=="\n" or Buffer=="\r" )  && Input.length()>0 ){
			Input.erase(Input.length()-1,1);
			if (Input.length()==0)
				break;
			Buffer = Input.at(Input.length()-1);
		}
	}
	return Input;
}